

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain(ngx_output_chain_ctx_t *ctx,ngx_chain_t *in)

{
  ngx_int_t nVar1;
  long local_80;
  long local_78;
  ngx_chain_t **local_70;
  ngx_chain_t **last_out;
  ngx_chain_t *out;
  ngx_chain_t *cl;
  ngx_int_t last;
  ngx_int_t rc;
  off_t bsize;
  ngx_chain_t *in_local;
  ngx_output_chain_ctx_t *ctx_local;
  
  bsize = (off_t)in;
  in_local = (ngx_chain_t *)ctx;
  if ((ctx->in == (ngx_chain_t *)0x0) && (ctx->busy == (ngx_chain_t *)0x0)) {
    if (in == (ngx_chain_t *)0x0) {
      nVar1 = (*ctx->output_filter)(ctx->filter_ctx,(ngx_chain_t *)0x0);
      return nVar1;
    }
    if ((in->next == (ngx_chain_t *)0x0) &&
       ((((*(ushort *)&in->buf->field_0x48 >> 4 & 1) == 0 || (in->buf->file_last < 0x80000001)) &&
        (nVar1 = ngx_output_chain_as_is(ctx,in->buf), nVar1 != 0)))) {
      nVar1 = (*(code *)in_local[5].next)(in_local[6].buf,bsize);
      return nVar1;
    }
  }
  if ((bsize != 0) &&
     (nVar1 = ngx_output_chain_add_copy
                        ((ngx_pool_t *)in_local[3].buf,&in_local->next,(ngx_chain_t *)bsize),
     nVar1 == -1)) {
    return -1;
  }
  last_out = (ngx_chain_t **)0x0;
  cl = (ngx_chain_t *)&DAT_00000001;
  do {
    local_70 = (ngx_chain_t **)&last_out;
    while (in_local->next != (ngx_chain_t *)0x0) {
      if ((((*(ushort *)&in_local->next->buf->field_0x48 & 1) == 0) &&
          ((*(ushort *)&in_local->next->buf->field_0x48 >> 1 & 1) == 0)) &&
         ((*(ushort *)&in_local->next->buf->field_0x48 >> 2 & 1) == 0)) {
        local_78 = in_local->next->buf->file_last - in_local->next->buf->file_pos;
      }
      else {
        local_78 = (long)in_local->next->buf->last - (long)in_local->next->buf->pos;
      }
      rc = local_78;
      if ((local_78 == 0) &&
         ((((((*(ushort *)&in_local->next->buf->field_0x48 >> 5 & 1) == 0 &&
             ((*(ushort *)&in_local->next->buf->field_0x48 >> 7 & 1) == 0)) &&
            ((*(ushort *)&in_local->next->buf->field_0x48 >> 6 & 1) == 0)) ||
           (((*(ushort *)&in_local->next->buf->field_0x48 & 1) != 0 ||
            ((*(ushort *)&in_local->next->buf->field_0x48 >> 1 & 1) != 0)))) ||
          (((*(ushort *)&in_local->next->buf->field_0x48 >> 2 & 1) != 0 ||
           ((*(ushort *)&in_local->next->buf->field_0x48 >> 4 & 1) != 0)))))) {
        if (1 < **(ulong **)&(in_local[3].buf)->field_0x48) {
          ngx_log_error_core(2,*(ngx_log_t **)&(in_local[3].buf)->field_0x48,0,
                             "zero size buf in output t:%d r:%d f:%d %p %p-%p %p %O-%O",
                             (ulong)(*(ushort *)&in_local->next->buf->field_0x48 & 1),
                             (ulong)(*(ushort *)&in_local->next->buf->field_0x48 >> 3 & 1),
                             (uint)(*(ushort *)&in_local->next->buf->field_0x48 >> 4 & 1),
                             in_local->next->buf->start,in_local->next->buf->pos,
                             in_local->next->buf->last,in_local->next->buf->file,
                             in_local->next->buf->file_pos,in_local->next->buf->file_last);
        }
        ngx_debug_point();
        in_local->next = in_local->next->next;
      }
      else {
        nVar1 = ngx_output_chain_as_is((ngx_output_chain_ctx_t *)in_local,in_local->next->buf);
        if (nVar1 == 0) {
          if (in_local->buf == (ngx_buf_t *)0x0) {
            last = ngx_output_chain_align_file_buf((ngx_output_chain_ctx_t *)in_local,rc);
            if (last == -1) {
              return -1;
            }
            if (last != 0) {
              if (in_local[1].buf == (ngx_buf_t *)0x0) {
                if ((last_out != (ngx_chain_t **)0x0) ||
                   ((ngx_buf_t *)in_local[3].next == in_local[4].buf)) break;
                nVar1 = ngx_output_chain_get_buf((ngx_output_chain_ctx_t *)in_local,rc);
                if (nVar1 != 0) {
                  return -1;
                }
              }
              else {
                out = (ngx_chain_t *)in_local[1].buf;
                in_local->buf = (ngx_buf_t *)((ngx_buf_t *)out)->pos;
                in_local[1].buf = (ngx_buf_t *)((ngx_buf_t *)out)->last;
                ((ngx_buf_t *)out)->last = (u_char *)(in_local[3].buf)->tag;
                (in_local[3].buf)->tag = out;
              }
            }
          }
          last = ngx_output_chain_copy_buf((ngx_output_chain_ctx_t *)in_local);
          if (last == -1) {
            return -1;
          }
          if (last == -2) {
            if (last_out == (ngx_chain_t **)0x0) {
              return -2;
            }
            break;
          }
          if ((((*(ushort *)&in_local->next->buf->field_0x48 & 1) == 0) &&
              ((*(ushort *)&in_local->next->buf->field_0x48 >> 1 & 1) == 0)) &&
             ((*(ushort *)&in_local->next->buf->field_0x48 >> 2 & 1) == 0)) {
            local_80 = in_local->next->buf->file_last - in_local->next->buf->file_pos;
          }
          else {
            local_80 = (long)in_local->next->buf->last - (long)in_local->next->buf->pos;
          }
          if (local_80 == 0) {
            in_local->next = in_local->next->next;
          }
          out = ngx_alloc_chain_link((ngx_pool_t *)in_local[3].buf);
          if (out == (ngx_chain_t *)0x0) {
            return -1;
          }
          out->buf = in_local->buf;
          out->next = (ngx_chain_t *)0x0;
          *local_70 = out;
          local_70 = &out->next;
          in_local->buf = (ngx_buf_t *)0x0;
        }
        else {
          out = in_local->next;
          in_local->next = out->next;
          *local_70 = out;
          local_70 = &out->next;
          out->next = (ngx_chain_t *)0x0;
        }
      }
    }
    if ((last_out == (ngx_chain_t **)0x0) && (cl != (ngx_chain_t *)&DAT_00000001)) {
      if (in_local->next != (ngx_chain_t *)0x0) {
        return -2;
      }
      return (ngx_int_t)cl;
    }
    cl = (ngx_chain_t *)(*(code *)in_local[5].next)(in_local[6].buf,last_out);
    if (cl == (ngx_chain_t *)0xffffffffffffffff) {
      return -1;
    }
    if (cl == (ngx_chain_t *)0xfffffffffffffffc) {
      return -4;
    }
    ngx_chain_update_chains
              ((ngx_pool_t *)in_local[3].buf,(ngx_chain_t **)(in_local + 1),&in_local[1].next,
               (ngx_chain_t **)&last_out,in_local[5].buf);
  } while( true );
}

Assistant:

ngx_int_t
ngx_output_chain(ngx_output_chain_ctx_t *ctx, ngx_chain_t *in)
{
    off_t         bsize;
    ngx_int_t     rc, last;
    ngx_chain_t  *cl, *out, **last_out;

    if (ctx->in == NULL && ctx->busy == NULL
#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        && !ctx->aio
#endif
       )
    {
        /*
         * the short path for the case when the ctx->in and ctx->busy chains
         * are empty, the incoming chain is empty too or has the single buf
         * that does not require the copy
         */

        if (in == NULL) {
            return ctx->output_filter(ctx->filter_ctx, in);
        }

        if (in->next == NULL
#if (NGX_SENDFILE_LIMIT)
            && !(in->buf->in_file && in->buf->file_last > NGX_SENDFILE_LIMIT)
#endif
            && ngx_output_chain_as_is(ctx, in->buf))
        {
            return ctx->output_filter(ctx->filter_ctx, in);
        }
    }

    /* add the incoming buf to the chain ctx->in */

    if (in) {
        if (ngx_output_chain_add_copy(ctx->pool, &ctx->in, in) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    out = NULL;
    last_out = &out;
    last = NGX_NONE;

    for ( ;; ) {

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        if (ctx->aio) {
            return NGX_AGAIN;
        }
#endif

        while (ctx->in) {

            /*
             * cycle while there are the ctx->in bufs
             * and there are the free output bufs to copy in
             */

            bsize = ngx_buf_size(ctx->in->buf);

            if (bsize == 0 && !ngx_buf_special(ctx->in->buf)) {

                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                              "zero size buf in output "
                              "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                              ctx->in->buf->temporary,
                              ctx->in->buf->recycled,
                              ctx->in->buf->in_file,
                              ctx->in->buf->start,
                              ctx->in->buf->pos,
                              ctx->in->buf->last,
                              ctx->in->buf->file,
                              ctx->in->buf->file_pos,
                              ctx->in->buf->file_last);

                ngx_debug_point();

                ctx->in = ctx->in->next;

                continue;
            }

            if (ngx_output_chain_as_is(ctx, ctx->in->buf)) {

                /* move the chain link to the output chain */

                cl = ctx->in;
                ctx->in = cl->next;

                *last_out = cl;
                last_out = &cl->next;
                cl->next = NULL;

                continue;
            }

            if (ctx->buf == NULL) {

                rc = ngx_output_chain_align_file_buf(ctx, bsize);

                if (rc == NGX_ERROR) {
                    return NGX_ERROR;
                }

                if (rc != NGX_OK) {

                    if (ctx->free) {

                        /* get the free buf */

                        cl = ctx->free;
                        ctx->buf = cl->buf;
                        ctx->free = cl->next;

                        ngx_free_chain(ctx->pool, cl);

                    } else if (out || ctx->allocated == ctx->bufs.num) {

                        break;

                    } else if (ngx_output_chain_get_buf(ctx, bsize) != NGX_OK) {
                        return NGX_ERROR;
                    }
                }
            }

            rc = ngx_output_chain_copy_buf(ctx);

            if (rc == NGX_ERROR) {
                return rc;
            }

            if (rc == NGX_AGAIN) {
                if (out) {
                    break;
                }

                return rc;
            }

            /* delete the completed buf from the ctx->in chain */

            if (ngx_buf_size(ctx->in->buf) == 0) {
                ctx->in = ctx->in->next;
            }

            cl = ngx_alloc_chain_link(ctx->pool);
            if (cl == NULL) {
                return NGX_ERROR;
            }

            cl->buf = ctx->buf;
            cl->next = NULL;
            *last_out = cl;
            last_out = &cl->next;
            ctx->buf = NULL;
        }

        if (out == NULL && last != NGX_NONE) {

            if (ctx->in) {
                return NGX_AGAIN;
            }

            return last;
        }

        last = ctx->output_filter(ctx->filter_ctx, out);

        if (last == NGX_ERROR || last == NGX_DONE) {
            return last;
        }

        ngx_chain_update_chains(ctx->pool, &ctx->free, &ctx->busy, &out,
                                ctx->tag);
        last_out = &out;
    }
}